

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::remap_render_pass_handle
          (Impl *this,VkRenderPass render_pass,VkRenderPass *out_render_pass)

{
  bool bVar1;
  const_iterator cVar2;
  long *in_FS_OFFSET;
  VkRenderPass render_pass_local;
  
  if (render_pass == (VkRenderPass)0x0) {
    *out_render_pass = (VkRenderPass)0x0;
  }
  else {
    render_pass_local = render_pass;
    cVar2 = std::
            _Hashtable<VkRenderPass_T_*,_std::pair<VkRenderPass_T_*const,_unsigned_long>,_std::allocator<std::pair<VkRenderPass_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkRenderPass_T_*>,_std::hash<VkRenderPass_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->render_pass_to_hash)._M_h,&render_pass_local);
    if (cVar2.super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false>.
        _M_cur == (__node_type *)0x0) {
      if (*(int *)(*in_FS_OFFSET + -0x20) < 2) {
        bVar1 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Cannot find render pass in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                          );
        if (bVar1) {
          return false;
        }
        fwrite("Fossilize WARN: Cannot find render pass in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
               ,0x7f,1,_stderr);
      }
      return false;
    }
    *out_render_pass =
         *(VkRenderPass *)
          ((long)cVar2.
                 super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false>.
                 _M_cur + 0x10);
  }
  return true;
}

Assistant:

bool StateRecorder::Impl::remap_render_pass_handle(VkRenderPass render_pass, VkRenderPass *out_render_pass) const
{
	if (render_pass == VK_NULL_HANDLE)
	{
		// Dynamic rendering.
		*out_render_pass = VK_NULL_HANDLE;
		return true;
	}

	auto itr = render_pass_to_hash.find(render_pass);
	if (itr == end(render_pass_to_hash))
	{
		LOGW_LEVEL("Cannot find render pass in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_render_pass = api_object_cast<VkRenderPass>(uint64_t(itr->second));
		return true;
	}
}